

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void bhdct_update(planck_unit_test_t *tc,ion_dictionary_t *dict,ion_key_t key,ion_value_t value,
                 ion_err_t expected_status,ion_result_count_t expected_count,
                 ion_boolean_t check_result)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  undefined7 in_register_00000081;
  
  iVar2 = dictionary_update(dict,key,value);
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,(int32_t)CONCAT71(in_register_00000081,expected_status),(int)iVar2.error,
                     0xf3,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                    );
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_int_are_equal
                      (tc,expected_count,iVar2.count,0xf4,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                      );
    if (pVar1 != '\0') {
      if (check_result != '\0') {
        bhdct_get(tc,dict,key,value,'\0',1);
        return;
      }
      return;
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
bhdct_update(
	planck_unit_test_t	*tc,
	ion_dictionary_t	*dict,
	ion_key_t			key,
	ion_value_t			value,
	ion_err_t			expected_status,
	ion_result_count_t	expected_count,
	ion_boolean_t		check_result
) {
	ion_status_t status = dictionary_update(dict, key, value);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (check_result) {
		bhdct_get(tc, dict, key, value, err_ok, 1);
	}
}